

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall cmOrderDirectories::FindImplicitConflicts(cmOrderDirectories *this)

{
  pointer ppcVar1;
  cmake *this_00;
  ostream *poVar2;
  string *psVar3;
  pointer ppcVar4;
  undefined1 local_360 [16];
  string text;
  string local_330;
  ostringstream w;
  ostringstream conflicts;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&conflicts);
  ppcVar1 = (this->ImplicitDirEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar4 = (this->ImplicitDirEntries).
                 super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppcVar4 != ppcVar1;
      ppcVar4 = ppcVar4 + 1) {
    cmOrderDirectoriesConstraint::FindImplicitConflicts(*ppcVar4,&conflicts);
  }
  std::__cxx11::stringbuf::str();
  if (text._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    poVar2 = std::operator<<((ostream *)&w,"Cannot generate a safe ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Purpose);
    poVar2 = std::operator<<(poVar2," for target ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2," because files in some directories may conflict with ");
    poVar2 = std::operator<<(poVar2," libraries in implicit directories:\n");
    poVar2 = std::operator<<(poVar2,(string *)&text);
    std::operator<<(poVar2,"Some of these libraries may not be found correctly.");
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_360);
    cmake::IssueMessage(this_00,WARNING,&local_330,(cmListFileBacktrace *)local_360);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8));
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  std::__cxx11::string::~string((string *)&text);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&conflicts);
  return;
}

Assistant:

void cmOrderDirectories::FindImplicitConflicts()
{
  // Check for items in implicit link directories that have conflicts
  // in the explicit directories.
  std::ostringstream conflicts;
  for (cmOrderDirectoriesConstraint* entry : this->ImplicitDirEntries) {
    entry->FindImplicitConflicts(conflicts);
  }

  // Skip warning if there were no conflicts.
  std::string const text = conflicts.str();
  if (text.empty()) {
    return;
  }

  // Warn about the conflicts.
  std::ostringstream w;
  w << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because files in some directories may conflict with "
    << " libraries in implicit directories:\n"
    << text << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING, w.str(), this->Target->GetBacktrace());
}